

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O2

apx_vm_serializer_t * apx_vm_serializer_new(void)

{
  apx_error_t aVar1;
  apx_vm_serializer_t *self;
  
  self = (apx_vm_serializer_t *)malloc(0x70);
  if (self != (apx_vm_serializer_t *)0x0) {
    aVar1 = apx_vm_serializer_create(self);
    if (aVar1 == 0) {
      return self;
    }
    free(self);
  }
  return (apx_vm_serializer_t *)0x0;
}

Assistant:

apx_vm_serializer_t* apx_vm_serializer_new(void)
{
   apx_vm_serializer_t* self = (apx_vm_serializer_t*)malloc(sizeof(apx_vm_serializer_t));
   if (self != NULL)
   {
      apx_error_t rc = apx_vm_serializer_create(self);
      if (rc != APX_NO_ERROR)
      {
         free(self);
         self = NULL;
      }
   }
   return self;
}